

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessesView.cpp
# Opt level: O1

void __thiscall ProcessesView::addItem(ProcessesView *this,int row,int column,QVariant *data)

{
  int iVar1;
  QStandardItem *this_00;
  QVariant QStack_48;
  
  this_00 = (QStandardItem *)operator_new(0x10);
  QStandardItem::QStandardItem(this_00);
  (**(code **)(*(long *)this_00 + 0x20))(this_00,data,0);
  QVariant::QVariant(&QStack_48,4);
  (**(code **)(*(long *)this_00 + 0x20))(this_00,&QStack_48,7);
  QVariant::~QVariant(&QStack_48);
  iVar1 = QAbstractItemView::model();
  QStandardItemModel::setItem(iVar1,row,(QStandardItem *)(ulong)(uint)column);
  return;
}

Assistant:

void ProcessesView::addItem(int row, int column, const QVariant &data) {
    auto *qItem = new QStandardItem();
    qItem->setData(data, Qt::DisplayRole);
    qItem->setTextAlignment(Qt::AlignHCenter);
    ((QStandardItemModel*)model())->setItem(row, column, qItem);
}